

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

size_t Catch::listTests(Config *config)

{
  TestCaseFilters *pTVar1;
  bool bVar2;
  int iVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  ulong uVar5;
  ostream *poVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  TestCaseFilters *pTVar10;
  long *plVar11;
  ulong uVar12;
  Code _colourCode;
  TestCase *pTVar13;
  bool bVar14;
  Colour colourGuard_1;
  string nameCol;
  Colour colourGuard;
  Text tagsWrapper;
  Text nameWrapper;
  Colour local_149;
  ulong local_148;
  long *local_140;
  TextAttributes local_138;
  char *local_118;
  long local_110;
  char local_108 [16];
  TestCase *local_f8;
  Config *local_f0;
  Text local_e8;
  ulong local_90;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  char local_78 [8];
  char local_70 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((config->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (config->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar9 = "All available test cases:\n";
    lVar8 = 0x1a;
  }
  else {
    pcVar9 = "Matching test cases:\n";
    lVar8 = 0x15;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar8);
  pIVar4 = getRegistryHub();
  iVar3 = (*pIVar4->_vptr_IRegistryHub[3])(pIVar4);
  local_140 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
                                ((long *)CONCAT44(extraout_var,iVar3));
  pTVar13 = (TestCase *)*local_140;
  local_f8 = (TestCase *)local_140[1];
  if (pTVar13 == local_f8) {
    local_148 = 0;
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    local_148 = 0;
    do {
      pTVar10 = (config->m_filterSets).
                super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar1 = (config->m_filterSets).
               super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      bVar14 = pTVar10 == pTVar1;
      if ((!bVar14) && (bVar2 = TestCaseFilters::shouldInclude(pTVar10,pTVar13), bVar2)) {
        do {
          pTVar10 = pTVar10 + 1;
          bVar14 = pTVar10 == pTVar1;
          if (bVar14) break;
          bVar2 = TestCaseFilters::shouldInclude(pTVar10,pTVar13);
        } while (bVar2);
      }
      if (bVar14) {
        uVar12 = (pTVar13->super_TestCaseInfo).name._M_string_length;
        uVar7 = (pTVar13->super_TestCaseInfo).tagsAsString._M_string_length;
        if (uVar5 < uVar7) {
          uVar5 = uVar7;
        }
        if (local_148 < uVar12) {
          local_148 = uVar12;
        }
      }
      pTVar13 = pTVar13 + 1;
    } while (pTVar13 != local_f8);
  }
  uVar12 = uVar5 + local_148;
  local_90 = uVar5;
  while (0x4b < uVar12) {
    local_148 = local_148 - (local_90 < 0x1f);
    local_90 = (local_90 - 1) + (ulong)(local_90 < 0x1f);
    uVar12 = local_90 + local_148;
  }
  pTVar13 = (TestCase *)*local_140;
  local_140 = (long *)0x0;
  if (pTVar13 != local_f8) {
    local_f0 = config;
    do {
      pTVar10 = (config->m_filterSets).
                super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar1 = (config->m_filterSets).
               super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      bVar14 = pTVar10 == pTVar1;
      if ((!bVar14) && (bVar2 = TestCaseFilters::shouldInclude(pTVar10,pTVar13), bVar2)) {
        do {
          pTVar10 = pTVar10 + 1;
          bVar14 = pTVar10 == pTVar1;
          if (bVar14) break;
          bVar2 = TestCaseFilters::shouldInclude(pTVar10,pTVar13);
        } while (bVar2);
      }
      config = local_f0;
      if (bVar14) {
        local_e8.str.field_2._M_local_buf[8] = '\t';
        local_e8.str.field_2._M_allocated_capacity = local_148;
        local_e8.str._M_dataplus._M_p = (pointer)0x2;
        local_e8.str._M_string_length = 4;
        Text::Text((Text *)local_88,(string *)pTVar13,(TextAttributes *)&local_e8);
        local_138.tabChar = '\t';
        local_138.width = local_90;
        local_138.initialIndent = 0;
        local_138.indent = 2;
        Text::Text(&local_e8,&(pTVar13->super_TestCaseInfo).tagsAsString,&local_138);
        if (0x1f < (ulong)((long)local_e8.lines.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_e8.lines.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start |
                          (long)local_48.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_48.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          uVar5 = (long)local_48.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5;
          lVar8 = 0;
          uVar12 = 0;
          do {
            local_138.initialIndent = (size_t)&local_138.width;
            local_138.indent = 0;
            local_138.width = local_138.width & 0xffffffffffffff00;
            if (uVar12 < uVar5) {
              _colourCode = None;
              if ((pTVar13->super_TestCaseInfo).isHidden != false) {
                _colourCode = FileName;
              }
              std::__cxx11::string::_M_assign((string *)&local_138);
            }
            else {
              _colourCode = FileName;
              std::__cxx11::string::_M_replace((ulong)&local_138,0,(char *)0x0,0x152c9c);
            }
            Colour::Colour((Colour *)&local_118,_colourCode);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_138.initialIndent,local_138.indent);
            Colour::~Colour((Colour *)&local_118);
            if ((uVar12 < (ulong)((long)local_e8.lines.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_e8.lines.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5)) &&
               (*(long *)((long)&(local_e8.lines.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                         lVar8) != 0)) {
              if (uVar12 == 0) {
                Colour::Colour(&local_149,FileName);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
                local_118 = local_108;
                std::__cxx11::string::_M_construct
                          ((ulong)&local_118,(char)local_148 - (char)local_138.indent);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,local_118,local_110);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
                if (local_118 != local_108) {
                  operator_delete(local_118);
                }
                Colour::~Colour(&local_149);
              }
              else {
                local_118 = local_108;
                std::__cxx11::string::_M_construct
                          ((ulong)&local_118,(char)local_148 - (char)local_138.indent);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,local_118,local_110);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    ",4);
                if (local_118 != local_108) {
                  operator_delete(local_118);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         *(char **)((long)&((local_e8.lines.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + lVar8),
                         *(long *)((long)&(local_e8.lines.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                          _M_string_length + lVar8));
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            if ((size_t *)local_138.initialIndent != &local_138.width) {
              operator_delete((void *)local_138.initialIndent);
            }
            uVar12 = uVar12 + 1;
            uVar5 = (long)local_48.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_48.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5;
            uVar7 = (long)local_e8.lines.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_e8.lines.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5;
            if (uVar7 < uVar5) {
              uVar7 = uVar5;
            }
            lVar8 = lVar8 + 0x20;
          } while (uVar12 < uVar7);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_e8.lines);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.str._M_dataplus._M_p != &local_e8.str.field_2) {
          operator_delete(local_e8.str._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        config = local_f0;
        if (local_88 != (undefined1  [8])local_78) {
          operator_delete((void *)local_88);
        }
        local_140 = (long *)((long)local_140 + 1);
      }
      pTVar13 = pTVar13 + 1;
    } while (pTVar13 != local_f8);
  }
  if ((config->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (config->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_e8.str._M_dataplus._M_p = (pointer)&local_e8.str.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"test case","");
    plVar11 = local_140;
    local_88 = (undefined1  [8])local_140;
    local_80._M_p = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_e8.str._M_dataplus._M_p,
               local_e8.str._M_dataplus._M_p + local_e8.str._M_string_length);
    poVar6 = operator<<((ostream *)&std::cout,(pluralise *)local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  else {
    local_e8.str._M_dataplus._M_p = (pointer)&local_e8.str.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"matching test case","");
    plVar11 = local_140;
    local_88 = (undefined1  [8])local_140;
    local_80._M_p = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_e8.str._M_dataplus._M_p,
               local_e8.str._M_dataplus._M_p + local_e8.str._M_string_length);
    poVar6 = operator<<((ostream *)&std::cout,(pluralise *)local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  if (local_80._M_p != local_70) {
    operator_delete(local_80._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.str._M_dataplus._M_p != &local_e8.str.field_2) {
    operator_delete(local_e8.str._M_dataplus._M_p);
  }
  return (size_t)(pointer)plVar11;
}

Assistant:

inline std::size_t listTests( Config const& config ) {
        if( config.filters().empty() )
            std::cout << "All available test cases:\n";
        else
            std::cout << "Matching test cases:\n";
        std::vector<TestCase> const& allTests = getRegistryHub().getTestCaseRegistry().getAllTests();
        std::vector<TestCase>::const_iterator it = allTests.begin(), itEnd = allTests.end();

        // First pass - get max tags
        std::size_t maxTagLen = 0;
        std::size_t maxNameLen = 0;
        for(; it != itEnd; ++it ) {
            if( matchesFilters( config.filters(), *it ) ) {
                maxTagLen = (std::max)( it->getTestCaseInfo().tagsAsString.size(), maxTagLen );
                maxNameLen = (std::max)( it->getTestCaseInfo().name.size(), maxNameLen );
            }
        }

        // Try to fit everything in. If not shrink tag column first, down to 30
        // then shrink name column until it all fits (strings will be wrapped within column)
        while( maxTagLen + maxNameLen > CATCH_CONFIG_CONSOLE_WIDTH-5 ) {
            if( maxTagLen > 30 )
                --maxTagLen;
            else
                --maxNameLen;
        }

        std::size_t matchedTests = 0;
        for( it = allTests.begin(); it != itEnd; ++it ) {
            if( matchesFilters( config.filters(), *it ) ) {
                matchedTests++;
                Text nameWrapper(   it->getTestCaseInfo().name,
                                    TextAttributes()
                                        .setWidth( maxNameLen )
                                        .setInitialIndent(2)
                                        .setIndent(4) );

                Text tagsWrapper(   it->getTestCaseInfo().tagsAsString,
                                    TextAttributes()
                                        .setWidth( maxTagLen )
                                        .setInitialIndent(0)
                                        .setIndent( 2 ) );

                for( std::size_t i = 0; i < (std::max)( nameWrapper.size(), tagsWrapper.size() ); ++i ) {
                    Colour::Code colour = Colour::None;
                    if( it->getTestCaseInfo().isHidden )
                        colour = Colour::SecondaryText;
                    std::string nameCol;
                    if( i < nameWrapper.size() ) {
                        nameCol = nameWrapper[i];
                    }
                    else {
                        nameCol = "    ...";
                        colour = Colour::SecondaryText;
                    }

                    {
                        Colour colourGuard( colour );
                        std::cout << nameCol;
                    }
                    if( i < tagsWrapper.size() && !tagsWrapper[i].empty() ) {
                        if( i == 0 ) {
                            Colour colourGuard( Colour::SecondaryText );
                            std::cout << "  " << std::string( maxNameLen - nameCol.size(), '.' ) << "  ";
                        }
                        else {
                            std::cout << std::string( maxNameLen - nameCol.size(), ' ' ) << "    ";
                        }
                        std::cout << tagsWrapper[i];
                    }
                    std::cout << "\n";
                }
            }
        }
        if( config.filters().empty() )
            std::cout << pluralise( matchedTests, "test case" ) << "\n" << std::endl;
        else
            std::cout << pluralise( matchedTests, "matching test case" ) << "\n" << std::endl;
        return matchedTests;
    }